

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ast.cpp
# Opt level: O0

void __thiscall Ast::descent_recursive(Ast *this,Node *current_node)

{
  Node *current_node_local;
  Ast *this_local;
  
  if (current_node != (Node *)0x0) {
    descent_recursive(this,current_node->operand1);
    descent_recursive(this,current_node->operand2);
    descent_recursive(this,current_node->operand3);
    descent_recursive(this,current_node->operand4);
  }
  return;
}

Assistant:

void Ast::descent_recursive(Node* current_node)
{
	if (current_node == nullptr) {
		return;
	}

	descent_recursive(current_node->operand1);
	descent_recursive(current_node->operand2);
	descent_recursive(current_node->operand3);
	descent_recursive(current_node->operand4);
}